

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O2

uint64_t aom_sum_sse_2d_i16_c(int16_t *src,int src_stride,int width,int height,int *sum)

{
  uint64_t uVar1;
  ulong uVar2;
  int16_t *srcp;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  if (height < 1) {
    height = 0;
  }
  for (iVar3 = 0; iVar3 != height; iVar3 = iVar3 + 1) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      iVar5 = (int)src[uVar4];
      *sum = *sum + iVar5;
      uVar1 = uVar1 + (uint)(iVar5 * iVar5);
    }
    src = src + src_stride;
  }
  return uVar1;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_c(const int16_t *src, int src_stride, int width,
                              int height, int *sum) {
  int r, c;
  int16_t *srcp = (int16_t *)src;
  int64_t ss = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const int16_t v = srcp[c];
      ss += v * v;
      *sum += v;
    }
    srcp += src_stride;
  }
  return ss;
}